

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.hpp
# Opt level: O2

bool __thiscall tf::Node::_is_cancelled(Node *this)

{
  bool bVar1;
  
  if ((this->_topology == (Topology *)0x0) ||
     (bVar1 = true,
     ((uint)(this->_topology->_estate).super___atomic_base<int>._M_i >> 0x1d & 1) == 0)) {
    if (this->_parent == (Node *)0x0) {
      return false;
    }
    bVar1 = (bool)((byte)((uint)(this->_parent->_estate).super___atomic_base<int>._M_i >> 0x1d) & 1)
    ;
  }
  return bVar1;
}

Assistant:

inline bool Node::_is_cancelled() const {
  return (_topology && (_topology->_estate.load(std::memory_order_relaxed) & ESTATE::CANCELLED)) 
         ||
         (_parent && (_parent->_estate.load(std::memory_order_relaxed) & ESTATE::CANCELLED));
}